

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_compact_surf_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  REF_MPI pRVar4;
  REF_CELL ref_cell;
  REF_INT *pRVar5;
  REF_STATUS RVar6;
  uint uVar7;
  REF_GLOB *pRVar8;
  long lVar9;
  void *array;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  REF_CELL *ppRVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  REF_INT cell;
  REF_INT nnode;
  REF_INT part;
  REF_INT nodes [27];
  int local_e8;
  int local_e4;
  REF_NODE local_e0;
  REF_INT local_d8;
  int local_d4;
  long *local_d0;
  long *local_c8;
  REF_MPI local_c0;
  REF_CELL *local_b8;
  long local_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_grid->node;
  iVar14 = local_e0->max;
  local_d8 = cell_id;
  local_c8 = ncell_global;
  if ((long)iVar14 < 0) {
    pcVar16 = "malloc *l2c of REF_GLOB negative";
    uVar11 = 0x25f;
LAB_00151a56:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar11,
           "ref_grid_compact_surf_id_nodes",pcVar16);
    uVar7 = 1;
  }
  else {
    pRVar4 = ref_grid->mpi;
    __size = (long)iVar14 * 8;
    pRVar8 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar8;
    if (pRVar8 == (REF_GLOB *)0x0) {
      pcVar16 = "malloc *l2c of REF_GLOB NULL";
      uVar11 = 0x25f;
LAB_00151ab4:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar11
             ,"ref_grid_compact_surf_id_nodes",pcVar16);
      return 2;
    }
    local_c0 = pRVar4;
    if (iVar14 != 0) {
      memset(pRVar8,0xff,__size);
    }
    iVar14 = 0;
    *nnode_global = 0;
    *local_c8 = 0;
    local_e4 = 0;
    local_b8 = ref_grid->cell;
    ppRVar13 = ref_grid->cell + 3;
    lVar9 = 3;
    local_e8 = 0;
    local_d0 = nnode_global;
    do {
      ref_cell = *ppRVar13;
      local_b0 = lVar9;
      if (0 < ref_cell->max) {
        cell = 0;
        do {
          RVar6 = ref_cell_nodes(ref_cell,cell,local_a8);
          if ((RVar6 == 0) && (local_a8[ref_cell->node_per] == local_d8)) {
            uVar7 = ref_cell_part(ref_cell,local_e0,cell,&local_d4);
            if (uVar7 != 0) {
              pcVar16 = "part";
              uVar11 = 0x269;
              goto LAB_00151a87;
            }
            local_e8 = local_e8 + (uint)(local_c0->id == local_d4);
            iVar1 = ref_cell->node_per;
            if (0 < (long)iVar1) {
              pRVar5 = local_e0->part;
              iVar2 = local_e0->ref_mpi->id;
              uVar15 = 0;
              do {
                iVar3 = local_a8[uVar15];
                if ((iVar2 == pRVar5[iVar3]) && ((*l2c)[iVar3] == -1)) {
                  (*l2c)[iVar3] = (long)iVar14;
                  iVar14 = iVar14 + 1;
                  local_e4 = iVar14;
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)(long)iVar1);
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      pRVar4 = local_c0;
      ppRVar13 = local_b8 + local_b0 + 1;
      lVar9 = local_b0 + 1;
    } while (lVar9 != 8);
    *local_c8 = (long)local_e8;
    uVar7 = ref_mpi_allsum(local_c0,local_c8,1,2);
    if (uVar7 == 0) {
      if ((long)pRVar4->n < 0) {
        pcVar16 = "malloc counts of REF_INT negative";
        uVar11 = 0x27b;
        goto LAB_00151a56;
      }
      array = malloc((long)pRVar4->n << 2);
      if (array == (void *)0x0) {
        pcVar16 = "malloc counts of REF_INT NULL";
        uVar11 = 0x27b;
        goto LAB_00151ab4;
      }
      uVar7 = ref_mpi_allgather(pRVar4,&local_e4,array,1);
      if (uVar7 == 0) {
        lVar9 = 0;
        if (0 < (long)pRVar4->id) {
          lVar10 = 0;
          do {
            lVar9 = (long)(int)lVar9 + (long)*(int *)((long)array + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (pRVar4->id != lVar10);
        }
        if (0 < (long)pRVar4->n) {
          lVar10 = *local_d0;
          lVar12 = 0;
          do {
            lVar10 = lVar10 + *(int *)((long)array + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (pRVar4->n != lVar12);
          *local_d0 = lVar10;
        }
        free(array);
        iVar14 = local_e0->max;
        pRVar8 = *l2c;
        if (0 < (long)iVar14) {
          lVar10 = 0;
          do {
            if (pRVar8[lVar10] != -1) {
              pRVar8[lVar10] = pRVar8[lVar10] + lVar9;
            }
            lVar10 = lVar10 + 1;
          } while (iVar14 != lVar10);
        }
        uVar7 = ref_node_ghost_glob(local_e0,pRVar8,1);
        if (uVar7 == 0) {
          return 0;
        }
        pcVar16 = "xfer";
        uVar11 = 0x28a;
      }
      else {
        pcVar16 = "gather size";
        uVar11 = 0x27c;
      }
    }
    else {
      pcVar16 = "allsum";
      uVar11 = 0x279;
    }
LAB_00151a87:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar11,
           "ref_grid_compact_surf_id_nodes",(ulong)uVar7,pcVar16);
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_surf_id_nodes(REF_GRID ref_grid,
                                                  REF_INT cell_id,
                                                  REF_GLOB *nnode_global,
                                                  REF_LONG *ncell_global,
                                                  REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset, group;
  REF_CELL ref_cell;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_grid_2d_ref_cell(ref_grid, group,
                            ref_cell){each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes){if (cell_id == nodes[ref_cell_id_index(ref_cell)]){
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
  if (ref_mpi_rank(ref_mpi) == part) {
    ncell++;
  }
  each_ref_cell_cell_node(ref_cell, cell_node) {
    if (ref_node_owned(ref_node, nodes[cell_node]) &&
        (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
      (*l2c)[nodes[cell_node]] = nnode;
      nnode++;
    }
  }
}
}
}

(*ncell_global) = ncell;
RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
offset = 0;
for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
  offset += counts[proc];
}
each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }